

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O1

int mmk_strneq(char *src,char *ref,size_t n)

{
  char cVar1;
  char *pcVar2;
  
  cVar1 = *src;
  if (cVar1 != '\0') {
    pcVar2 = src + 1;
    do {
      if ((*ref == '\0') || (n == 0)) break;
      if (cVar1 != *ref) {
        return 0;
      }
      ref = ref + 1;
      n = n - 1;
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  if (n != 0) {
    return (int)(*ref == '\0');
  }
  return 1;
}

Assistant:

int mmk_strneq(const char *src, const char *ref, size_t n)
{
    for (; *src && *ref && n; ++src, ++ref, --n) {
        if (*src != *ref)
            return 0;
    }
    return n == 0 || !*ref;
}